

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O0

_Bool check_hw_breakpoints(CPUX86State *env,_Bool force_dr6_update)

{
  _Bool _Var1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  bool bVar5;
  int local_24;
  _Bool wp_match;
  _Bool bp_match;
  _Bool hit_enabled;
  ulong uStack_20;
  int reg;
  target_ulong dr6;
  _Bool force_dr6_update_local;
  CPUX86State *env_local;
  
  _Var1 = false;
  uStack_20 = env->dr[6] & 0xfffffffffffffff0;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    bVar5 = false;
    bVar2 = false;
    iVar4 = hw_breakpoint_type(env->dr[7],local_24);
    switch(iVar4) {
    case 0:
      bVar5 = env->dr[local_24] == env->eip;
      break;
    case 1:
    case 3:
      if ((env->dr[(long)local_24 + 8] != 0) &&
         ((*(uint *)(env->dr[(long)local_24 + 8] + 0x1c) & 0xc0) != 0)) {
        bVar2 = true;
      }
      break;
    case 2:
    }
    if ((bVar5) || (bVar2)) {
      uStack_20 = 1L << ((byte)local_24 & 0x3f) | uStack_20;
      _Var3 = hw_breakpoint_enabled(env->dr[7],local_24);
      if (_Var3) {
        _Var1 = true;
      }
    }
  }
  if ((_Var1 != false) || (force_dr6_update)) {
    env->dr[6] = uStack_20;
  }
  return _Var1;
}

Assistant:

static bool check_hw_breakpoints(CPUX86State *env, bool force_dr6_update)
{
    target_ulong dr6;
    int reg;
    bool hit_enabled = false;

    dr6 = env->dr[6] & ~0xf;
    for (reg = 0; reg < DR7_MAX_BP; reg++) {
        bool bp_match = false;
        bool wp_match = false;

        switch (hw_breakpoint_type(env->dr[7], reg)) {
        case DR7_TYPE_BP_INST:
            if (env->dr[reg] == env->eip) {
                bp_match = true;
            }
            break;
        case DR7_TYPE_DATA_WR:
        case DR7_TYPE_DATA_RW:
            if (env->cpu_watchpoint[reg] &&
                env->cpu_watchpoint[reg]->flags & BP_WATCHPOINT_HIT) {
                wp_match = true;
            }
            break;
        case DR7_TYPE_IO_RW:
            break;
        }
        if (bp_match || wp_match) {
            dr6 |= 1ULL << reg;
            if (hw_breakpoint_enabled(env->dr[7], reg)) {
                hit_enabled = true;
            }
        }
    }

    if (hit_enabled || force_dr6_update) {
        env->dr[6] = dr6;
    }

    return hit_enabled;
}